

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

void * SplittingStepCreate(SUNStepper_conflict *steppers,int partitions,sunrealtype t0,N_Vector y0,
                          SUNContext_conflict sunctx)

{
  int iVar1;
  ARKodeMem ark_mem_00;
  ARKodeSplittingStepMem step_mem;
  int iVar2;
  char *pcVar3;
  ARKodeMem ark_mem;
  sunrealtype local_30;
  
  local_30 = t0;
  iVar1 = splittingStep_CheckArgs((ARKodeMem)0x0,steppers,partitions,y0);
  if (iVar1 != 0) {
    return (void *)0x0;
  }
  if (sunctx == (SUNContext_conflict)0x0) {
    pcVar3 = "sunctx = NULL illegal.";
    iVar1 = -0x16;
    iVar2 = 0x23c;
LAB_00157e47:
    arkProcessError((ARKodeMem)0x0,iVar1,iVar2,"SplittingStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                    ,pcVar3);
    return (void *)0x0;
  }
  ark_mem_00 = arkCreate(sunctx);
  if (ark_mem_00 == (ARKodeMem)0x0) {
    pcVar3 = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    iVar2 = 0x245;
    ark_mem = (ARKodeMem)0x0;
    goto LAB_00157e47;
  }
  ark_mem = ark_mem_00;
  step_mem = (ARKodeSplittingStepMem)malloc(0x20);
  if (step_mem == (ARKodeSplittingStepMem)0x0) {
    pcVar3 = "Allocation of arkode_mem failed.";
    iVar1 = -0x14;
    iVar2 = 0x24e;
  }
  else {
    step_mem->partitions = partitions;
    step_mem->order = 0;
    step_mem->steppers = (SUNStepper_conflict *)0x0;
    step_mem->coefficients = (SplittingStepCoefficients)0x0;
    step_mem->n_stepper_evolves = (long *)0x0;
    iVar1 = splittingStep_InitStepMem(ark_mem_00,step_mem,steppers,partitions);
    if (iVar1 != 0) goto LAB_00157e77;
    ark_mem_00->step_init = splittingStep_Init;
    ark_mem_00->step_fullrhs = splittingStep_FullRHS;
    ark_mem_00->step = splittingStep_TakeStep;
    ark_mem_00->step_printallstats = splittingStep_PrintAllStats;
    ark_mem_00->step_writeparameters = splittingStep_WriteParameters;
    ark_mem_00->step_free = splittingStep_Free;
    ark_mem_00->step_printmem = splittingStep_PrintMem;
    ark_mem_00->step_setdefaults = splittingStep_SetDefaults;
    ark_mem_00->step_setorder = splittingStep_SetOrder;
    ark_mem_00->step_mem = step_mem;
    iVar1 = splittingStep_SetDefaults(ark_mem_00);
    if (iVar1 == 0) {
      iVar1 = arkInit(ark_mem_00,local_30,y0,0);
      if (iVar1 == 0) {
        ARKodeSetInterpolantType(ark_mem_00,1);
        return ark_mem_00;
      }
      pcVar3 = "Unable to initialize main ARKODE infrastructure";
      iVar2 = 0x27a;
    }
    else {
      pcVar3 = "Error setting default solver options";
      iVar2 = 0x270;
    }
  }
  arkProcessError(ark_mem_00,iVar1,iVar2,"SplittingStepCreate",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                  ,pcVar3);
LAB_00157e77:
  ARKodeFree(&ark_mem);
  return (void *)0x0;
}

Assistant:

void* SplittingStepCreate(SUNStepper* steppers, int partitions, sunrealtype t0,
                          N_Vector y0, SUNContext sunctx)
{
  int retval = splittingStep_CheckArgs(NULL, steppers, partitions, y0);
  if (retval != ARK_SUCCESS) { return NULL; }

  if (sunctx == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return NULL;
  }

  /* Create ark_mem structure and set default values */
  ARKodeMem ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return NULL;
  }

  ARKodeSplittingStepMem step_mem =
    (ARKodeSplittingStepMem)malloc(sizeof(*step_mem));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  step_mem->partitions        = partitions;
  step_mem->order             = 0;
  step_mem->steppers          = NULL;
  step_mem->n_stepper_evolves = NULL;
  step_mem->coefficients      = NULL;
  retval = splittingStep_InitStepMem(ark_mem, step_mem, steppers, partitions);
  if (retval != ARK_SUCCESS)
  {
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_init            = splittingStep_Init;
  ark_mem->step_fullrhs         = splittingStep_FullRHS;
  ark_mem->step                 = splittingStep_TakeStep;
  ark_mem->step_printallstats   = splittingStep_PrintAllStats;
  ark_mem->step_writeparameters = splittingStep_WriteParameters;
  ark_mem->step_free            = splittingStep_Free;
  ark_mem->step_printmem        = splittingStep_PrintMem;
  ark_mem->step_setdefaults     = splittingStep_SetDefaults;
  ark_mem->step_setorder        = splittingStep_SetOrder;
  ark_mem->step_mem             = (void*)step_mem;

  /* Set default values for ARKStep optional inputs */
  retval = splittingStep_SetDefaults(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  ARKodeSetInterpolantType(ark_mem, ARK_INTERP_LAGRANGE);

  return ark_mem;
}